

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O3

String * __thiscall luna::State::GetString(State *this,string *str)

{
  String *this_00;
  
  this_00 = StringPool::GetString
                      ((this->string_pool_)._M_t.
                       super___uniq_ptr_impl<luna::StringPool,_std::default_delete<luna::StringPool>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_luna::StringPool_*,_std::default_delete<luna::StringPool>_>
                       .super__Head_base<0UL,_luna::StringPool_*,_false>._M_head_impl,str);
  if (this_00 == (String *)0x0) {
    this_00 = GC::NewString((this->gc_)._M_t.
                            super___uniq_ptr_impl<luna::GC,_std::default_delete<luna::GC>_>._M_t.
                            super__Tuple_impl<0UL,_luna::GC_*,_std::default_delete<luna::GC>_>.
                            super__Head_base<0UL,_luna::GC_*,_false>._M_head_impl,GCGen0);
    String::SetValue(this_00,str);
    StringPool::AddString
              ((this->string_pool_)._M_t.
               super___uniq_ptr_impl<luna::StringPool,_std::default_delete<luna::StringPool>_>._M_t.
               super__Tuple_impl<0UL,_luna::StringPool_*,_std::default_delete<luna::StringPool>_>.
               super__Head_base<0UL,_luna::StringPool_*,_false>._M_head_impl,this_00);
  }
  return this_00;
}

Assistant:

String * State::GetString(const std::string &str)
    {
        auto s = string_pool_->GetString(str);
        if (!s)
        {
            s = gc_->NewString();
            s->SetValue(str);
            string_pool_->AddString(s);
        }
        return s;
    }